

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O3

void __thiscall
Assimp::ColladaParser::ReadControllerWeights(ColladaParser *this,Controller *pController)

{
  byte *pbVar1;
  char *pcVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  char *__s1;
  char *pcVar7;
  undefined4 extraout_var_02;
  byte *pbVar8;
  undefined4 extraout_var_03;
  Accessor **ppAVar9;
  undefined4 extraout_var_04;
  ostream *poVar10;
  pointer puVar11;
  pointer ppVar12;
  ulong uVar13;
  size_type __new_size;
  InputChannel channel;
  char *attrSource;
  char *attrSemantic;
  uint uStack_24c;
  size_t sStack_240;
  undefined1 *local_238;
  char *local_230;
  undefined1 local_228;
  undefined7 uStack_227;
  Accessor *local_218;
  Accessor **local_210;
  string *local_208;
  InputChannel *local_200;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *local_1f8;
  Accessor **local_1f0;
  string *local_1e8;
  InputChannel *local_1e0;
  string local_1d8;
  char *local_1b8;
  char *local_1b0;
  string local_1a8 [11];
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  uVar3 = GetAttribute(this,"count");
  iVar4 = (*this->mReader->_vptr_IIrrXMLReader[10])(this->mReader,(ulong)uVar3);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&pController->mWeightCounts,(long)iVar4);
  iVar5 = (*this->mReader->_vptr_IIrrXMLReader[2])();
  if ((char)iVar5 != '\0') {
    local_1f8 = &pController->mWeights;
    local_1e0 = &pController->mWeightInputWeights;
    local_1e8 = (string *)&(pController->mWeightInputWeights).mAccessor;
    local_1f0 = &(pController->mWeightInputWeights).mResolved;
    local_200 = &pController->mWeightInputJoints;
    local_208 = (string *)&(pController->mWeightInputJoints).mAccessor;
    local_210 = &(pController->mWeightInputJoints).mResolved;
    do {
      iVar5 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      iVar6 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar5 == 1) {
        if (iVar6 != 1) {
LAB_00416eaf:
          __assert_fail("mReader->getNodeType() == irr::io::EXN_ELEMENT",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Collada/ColladaParser.h"
                        ,0x178,"bool Assimp::ColladaParser::IsElement(const char *) const");
        }
        iVar5 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar5 = strcmp((char *)CONCAT44(extraout_var,iVar5),"input");
        if ((iVar4 == 0) || (iVar5 != 0)) {
          iVar5 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar5 != 1) goto LAB_00416eaf;
          iVar5 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
          iVar5 = strcmp((char *)CONCAT44(extraout_var_02,iVar5),"vcount");
          if ((iVar4 == 0) || (iVar5 != 0)) {
            iVar5 = (*this->mReader->_vptr_IIrrXMLReader[3])();
            if (iVar5 != 1) goto LAB_00416eaf;
            iVar5 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
            if (((*(char *)CONCAT44(extraout_var_03,iVar5) == 'v') && (iVar4 != 0)) &&
               (((char *)CONCAT44(extraout_var_03,iVar5))[1] == '\0')) {
              pbVar8 = (byte *)GetTextContent(this);
              ppVar12 = (pController->mWeights).
                        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (ppVar12 !=
                  (pController->mWeights).
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                uVar13 = (ulong)*pbVar8;
                do {
                  if ((char)uVar13 == '\0') {
                    local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_1a8,"Out of data while reading <vertex_weights>","");
                    ThrowException(this,local_1a8);
                  }
                  if ((byte)((char)uVar13 - 0x3aU) < 0xf6) {
                    uVar13 = 0;
                  }
                  else {
                    uVar3 = 0;
                    do {
                      uVar3 = (uint)(byte)((char)uVar13 - 0x30) + uVar3 * 10;
                      pbVar1 = pbVar8 + 1;
                      uVar13 = (ulong)*pbVar1;
                      pbVar8 = pbVar8 + 1;
                    } while (0xf5 < (byte)(*pbVar1 - 0x3a));
                    uVar13 = (ulong)uVar3;
                  }
                  ppVar12->first = uVar13;
                  while( true ) {
                    uVar13 = (ulong)*pbVar8;
                    if (0x20 < uVar13) break;
                    if ((0x100002600U >> (uVar13 & 0x3f) & 1) == 0) {
                      if (uVar13 == 0) {
                        local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_1a8,"Out of data while reading <vertex_weights>",
                                   "");
                        ThrowException(this,local_1a8);
                      }
                      break;
                    }
                    pbVar8 = pbVar8 + 1;
                  }
                  if ((byte)(*pbVar8 - 0x3a) < 0xf6) {
                    uVar13 = 0;
                  }
                  else {
                    uVar3 = 0;
                    do {
                      uVar3 = (uint)(byte)((char)uVar13 - 0x30) + uVar3 * 10;
                      pbVar1 = pbVar8 + 1;
                      uVar13 = (ulong)*pbVar1;
                      pbVar8 = pbVar8 + 1;
                    } while (0xf5 < (byte)(*pbVar1 - 0x3a));
                    uVar13 = (ulong)uVar3;
                  }
                  ppVar12->second = uVar13;
                  while ((uVar13 = (ulong)*pbVar8, uVar13 < 0x21 &&
                         ((0x100002600U >> (uVar13 & 0x3f) & 1) != 0))) {
                    pbVar8 = pbVar8 + 1;
                  }
                  ppVar12 = ppVar12 + 1;
                } while (ppVar12 !=
                         (pController->mWeights).
                         super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
              }
              TestClosing(this,"v");
            }
            else {
              SkipElement(this);
            }
          }
          else {
            pbVar8 = (byte *)GetTextContent(this);
            puVar11 = (pController->mWeightCounts).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if (puVar11 ==
                (pController->mWeightCounts).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              __new_size = 0;
            }
            else {
              uVar13 = (ulong)*pbVar8;
              __new_size = 0;
              do {
                if ((char)uVar13 == '\0') {
                  local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_1a8,"Out of data while reading <vcount>","");
                  ThrowException(this,local_1a8);
                }
                if ((byte)((char)uVar13 - 0x3aU) < 0xf6) {
                  uVar3 = 0;
                }
                else {
                  uVar3 = 0;
                  do {
                    uVar3 = (uint)(byte)((char)uVar13 - 0x30) + uVar3 * 10;
                    pbVar1 = pbVar8 + 1;
                    uVar13 = (ulong)*pbVar1;
                    pbVar8 = pbVar8 + 1;
                  } while (0xf5 < (byte)(*pbVar1 - 0x3a));
                }
                *puVar11 = (ulong)uVar3;
                while ((uVar13 = (ulong)*pbVar8, uVar13 < 0x21 &&
                       ((0x100002600U >> (uVar13 & 0x3f) & 1) != 0))) {
                  pbVar8 = pbVar8 + 1;
                }
                __new_size = __new_size + uVar3;
                puVar11 = puVar11 + 1;
              } while (puVar11 !=
                       (pController->mWeightCounts).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish);
            }
            TestClosing(this,"vcount");
            std::
            vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ::resize(local_1f8,__new_size);
          }
        }
        else {
          local_230 = (char *)0x0;
          local_228 = 0;
          local_218 = (Accessor *)0x0;
          sStack_240 = 0;
          local_238 = &local_228;
          uVar3 = GetAttribute(this,"semantic");
          iVar5 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar3);
          __s1 = (char *)CONCAT44(extraout_var_00,iVar5);
          local_1b0 = __s1;
          uVar3 = GetAttribute(this,"source");
          iVar5 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar3);
          pcVar7 = (char *)CONCAT44(extraout_var_01,iVar5);
          local_1b8 = pcVar7;
          iVar5 = TestAttribute(this,"offset");
          if (-1 < iVar5) {
            iVar5 = (*this->mReader->_vptr_IIrrXMLReader[10])();
            sStack_240 = (size_t)iVar5;
          }
          pcVar2 = local_230;
          if (*pcVar7 != '#') {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Unsupported URL format in \"",0x1b);
            poVar10 = (ostream *)
                      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                      operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                                  *)local_1a8,&local_1b8);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,"\" in source attribute of <vertex_weights> data <input> element",
                       0x3e);
            std::__cxx11::stringbuf::str();
            ThrowException(this,&local_1d8);
          }
          strlen(pcVar7 + 1);
          std::__cxx11::string::_M_replace((ulong)&local_238,0,pcVar2,(ulong)(pcVar7 + 1));
          iVar5 = strcmp(__s1,"JOINT");
          if (iVar5 == 0) {
            local_200->mOffset = sStack_240;
            *(ulong *)local_200 = (ulong)uStack_24c << 0x20;
            local_200->mIndex = 0;
            std::__cxx11::string::_M_assign(local_208);
            ppAVar9 = local_210;
          }
          else {
            iVar5 = strcmp(__s1,"WEIGHT");
            if (iVar5 != 0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"Unknown semantic \"",0x12);
              poVar10 = (ostream *)
                        Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                        ::operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                                      *)local_1a8,&local_1b0);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,"\" in <vertex_weights> data <input> element",0x2a);
              std::__cxx11::stringbuf::str();
              ThrowException(this,&local_1d8);
            }
            local_1e0->mOffset = sStack_240;
            *(ulong *)local_1e0 = (ulong)uStack_24c << 0x20;
            local_1e0->mIndex = 0;
            std::__cxx11::string::_M_assign(local_1e8);
            ppAVar9 = local_1f0;
          }
          *ppAVar9 = local_218;
          iVar5 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
          if ((char)iVar5 == '\0') {
            SkipElement(this);
          }
          if (local_238 != &local_228) {
            operator_delete(local_238,CONCAT71(uStack_227,local_228) + 1);
          }
        }
      }
      else if (iVar6 == 2) {
        iVar4 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar4 = strcmp((char *)CONCAT44(extraout_var_04,iVar4),"vertex_weights");
        if (iVar4 == 0) {
          return;
        }
        local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"Expected end of <vertex_weights> element.","");
        ThrowException(this,local_1a8);
      }
      iVar5 = (*this->mReader->_vptr_IIrrXMLReader[2])();
    } while ((char)iVar5 != '\0');
  }
  return;
}

Assistant:

void ColladaParser::ReadControllerWeights(Collada::Controller& pController)
{
    // read vertex count from attributes and resize the array accordingly
    int indexCount = GetAttribute("count");
    size_t vertexCount = (size_t)mReader->getAttributeValueAsInt(indexCount);
    pController.mWeightCounts.resize(vertexCount);

    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            // Input channels for weight data. Two possible semantics: "JOINT" and "WEIGHT"
            if (IsElement("input") && vertexCount > 0)
            {
                InputChannel channel;

                int indexSemantic = GetAttribute("semantic");
                const char* attrSemantic = mReader->getAttributeValue(indexSemantic);
                int indexSource = GetAttribute("source");
                const char* attrSource = mReader->getAttributeValue(indexSource);
                int indexOffset = TestAttribute("offset");
                if (indexOffset >= 0)
                    channel.mOffset = mReader->getAttributeValueAsInt(indexOffset);

                // local URLS always start with a '#'. We don't support global URLs
                if (attrSource[0] != '#')
                    ThrowException(format() << "Unsupported URL format in \"" << attrSource << "\" in source attribute of <vertex_weights> data <input> element");
                channel.mAccessor = attrSource + 1;

                // parse source URL to corresponding source
                if (strcmp(attrSemantic, "JOINT") == 0)
                    pController.mWeightInputJoints = channel;
                else if (strcmp(attrSemantic, "WEIGHT") == 0)
                    pController.mWeightInputWeights = channel;
                else
                    ThrowException(format() << "Unknown semantic \"" << attrSemantic << "\" in <vertex_weights> data <input> element");

                // skip inner data, if present
                if (!mReader->isEmptyElement())
                    SkipElement();
            }
            else if (IsElement("vcount") && vertexCount > 0)
            {
                // read weight count per vertex
                const char* text = GetTextContent();
                size_t numWeights = 0;
                for (std::vector<size_t>::iterator it = pController.mWeightCounts.begin(); it != pController.mWeightCounts.end(); ++it)
                {
                    if (*text == 0)
                        ThrowException("Out of data while reading <vcount>");

                    *it = strtoul10(text, &text);
                    numWeights += *it;
                    SkipSpacesAndLineEnd(&text);
                }

                TestClosing("vcount");

                // reserve weight count
                pController.mWeights.resize(numWeights);
            }
            else if (IsElement("v") && vertexCount > 0)
            {
                // read JointIndex - WeightIndex pairs
                const char* text = GetTextContent();

                for (std::vector< std::pair<size_t, size_t> >::iterator it = pController.mWeights.begin(); it != pController.mWeights.end(); ++it)
                {
                    if (*text == 0)
                        ThrowException("Out of data while reading <vertex_weights>");
                    it->first = strtoul10(text, &text);
                    SkipSpacesAndLineEnd(&text);
                    if (*text == 0)
                        ThrowException("Out of data while reading <vertex_weights>");
                    it->second = strtoul10(text, &text);
                    SkipSpacesAndLineEnd(&text);
                }

                TestClosing("v");
            }
            else
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            if (strcmp(mReader->getNodeName(), "vertex_weights") != 0)
                ThrowException("Expected end of <vertex_weights> element.");

            break;
        }
    }
}